

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadANIM(B3DImporter *this)

{
  aiAnimation *this_00;
  pointer paVar1;
  double dVar2;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> local_20;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  float fps;
  int frames;
  B3DImporter *this_local;
  
  ReadInt(this);
  anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl._4_4_ = ReadInt(this);
  anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl._0_4_ = ReadFloat(this);
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>::
  unique_ptr<std::default_delete<aiAnimation>,void>
            ((unique_ptr<aiAnimation,std::default_delete<aiAnimation>> *)&local_20,this_00);
  dVar2 = (double)anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                  _M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl._4_4_;
  paVar1 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->(&local_20);
  paVar1->mDuration = dVar2;
  dVar2 = (double)anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                  _M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl._0_4_;
  paVar1 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->(&local_20);
  paVar1->mTicksPerSecond = dVar2;
  std::
  vector<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>,std::allocator<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>>
  ::emplace_back<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>
            ((vector<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>,std::allocator<std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>>>
              *)&this->_animations,&local_20);
  std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void B3DImporter::ReadANIM(){
    /*int flags=*/ReadInt();
    int frames=ReadInt();
    float fps=ReadFloat();

    std::unique_ptr<aiAnimation> anim(new aiAnimation);

    anim->mDuration=frames;
    anim->mTicksPerSecond=fps;
    _animations.emplace_back( std::move(anim) );
}